

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::StructuredAssignmentPatternSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,StructuredAssignmentPatternSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_60;
  size_t index_local;
  StructuredAssignmentPatternSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->openBrace).kind;
    token._2_1_ = (this->openBrace).field_0x2;
    token.numFlags.raw = (this->openBrace).numFlags.raw;
    token.rawLen = (this->openBrace).rawLen;
    token.info = (this->openBrace).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    local_60 = (SyntaxNode *)0x0;
    if (this != (StructuredAssignmentPatternSyntax *)0xffffffffffffffe0) {
      local_60 = &(this->items).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
  }
  else if (index == 2) {
    token_00.kind = (this->closeBrace).kind;
    token_00._2_1_ = (this->closeBrace).field_0x2;
    token_00.numFlags.raw = (this->closeBrace).numFlags.raw;
    token_00.rawLen = (this->closeBrace).rawLen;
    token_00.info = (this->closeBrace).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax StructuredAssignmentPatternSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openBrace;
        case 1: return &items;
        case 2: return closeBrace;
        default: return nullptr;
    }
}